

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall
icu_63::DecimalFormat::DecimalFormat(DecimalFormat *this,UnicodeString *pattern,UErrorCode *status)

{
  DecimalFormat(this,(DecimalFormatSymbols *)0x0,status);
  setPropertiesFromPattern(this,pattern,1,status);
  touch(this,status);
  return;
}

Assistant:

DecimalFormat::DecimalFormat(const UnicodeString& pattern, UErrorCode& status)
        : DecimalFormat(nullptr, status) {
    setPropertiesFromPattern(pattern, IGNORE_ROUNDING_IF_CURRENCY, status);
    touch(status);
}